

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readokt.c
# Opt level: O0

int it_okt_read_pattern(IT_PATTERN *pattern,uchar *data,int length,int n_channels)

{
  void *pvVar1;
  int in_ECX;
  int in_EDX;
  undefined1 *in_RSI;
  uint *in_RDI;
  IT_ENTRY *entry;
  int n_rows;
  int row;
  int channel;
  int pos;
  undefined1 *local_38;
  uint local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_4;
  
  if (in_EDX < 2) {
    local_4 = -1;
  }
  else {
    local_30 = (uint)CONCAT11(*in_RSI,in_RSI[1]);
    if (local_30 == 0) {
      local_30 = 0x40;
    }
    if (in_EDX < (int)(local_30 * in_ECX * 4 + 2)) {
      local_4 = -1;
    }
    else {
      *in_RDI = local_30;
      in_RDI[1] = local_30;
      local_24 = 2;
      for (local_2c = 0; local_2c < (int)*in_RDI; local_2c = local_2c + 1) {
        for (local_28 = 0; local_28 < in_ECX; local_28 = local_28 + 1) {
          if (in_RSI[local_24] != '\0' || in_RSI[local_24 + 2] != '\0') {
            in_RDI[1] = in_RDI[1] + 1;
          }
          local_24 = local_24 + 4;
        }
      }
      pvVar1 = malloc((long)(int)in_RDI[1] * 7);
      *(void **)(in_RDI + 2) = pvVar1;
      if (*(long *)(in_RDI + 2) == 0) {
        local_4 = -1;
      }
      else {
        local_38 = *(undefined1 **)(in_RDI + 2);
        local_24 = 2;
        for (local_2c = 0; local_2c < (int)local_30; local_2c = local_2c + 1) {
          for (local_28 = 0; local_28 < in_ECX; local_28 = local_28 + 1) {
            if (in_RSI[local_24] != '\0' || in_RSI[local_24 + 2] != '\0') {
              *local_38 = (char)local_28;
              local_38[1] = 0;
              if ((in_RSI[local_24] != '\0') && ((byte)in_RSI[local_24] < 0x25)) {
                local_38[1] = local_38[1] | 3;
                local_38[2] = in_RSI[local_24] + '#';
                local_38[3] = in_RSI[local_24 + 1] + '\x01';
              }
              local_38[5] = 0;
              local_38[6] = in_RSI[(long)local_24 + 3];
              switch(in_RSI[(long)local_24 + 2]) {
              case 1:
                if (in_RSI[local_24 + 3] != '\0') {
                  local_38[5] = 6;
                }
                break;
              case 2:
                if (in_RSI[local_24 + 3] != '\0') {
                  local_38[5] = 5;
                }
                break;
              case 10:
                if (in_RSI[local_24 + 3] != '\0') {
                  local_38[5] = 0x2a;
                }
                break;
              case 0xb:
                if (in_RSI[local_24 + 3] != '\0') {
                  local_38[5] = 0x2b;
                }
                break;
              case 0xc:
                if (in_RSI[local_24 + 3] != '\0') {
                  local_38[5] = 0x2c;
                }
                break;
              case 0xd:
                if (in_RSI[local_24 + 3] != '\0') {
                  local_38[5] = 0x26;
                }
                break;
              case 0xf:
                local_38[5] = 0x13;
                local_38[6] = in_RSI[local_24 + 3] & 0xf;
                break;
              case 0x11:
                if (in_RSI[local_24 + 3] != '\0') {
                  local_38[5] = 0x28;
                }
                break;
              case 0x15:
                if (in_RSI[local_24 + 3] != '\0') {
                  local_38[5] = 0x27;
                }
                break;
              case 0x19:
                local_38[5] = 2;
                break;
              case 0x1b:
                local_38[2] = 0xff;
                local_38[1] = local_38[1] | 1;
                break;
              case 0x1c:
                local_38[5] = 1;
                break;
              case 0x1e:
                if (in_RSI[local_24 + 3] != '\0') {
                  local_38[5] = 0x29;
                }
                break;
              case 0x1f:
                if ((byte)in_RSI[local_24 + 3] < 0x41) {
                  local_38[5] = 0xd;
                }
                else if ((byte)in_RSI[local_24 + 3] < 0x51) {
                  local_38[5] = 0x2d;
                  local_38[6] = in_RSI[local_24 + 3] + -0x40;
                }
                else if ((byte)in_RSI[local_24 + 3] < 0x61) {
                  local_38[5] = 0x2e;
                  local_38[6] = in_RSI[local_24 + 3] + -0x50;
                }
                else if ((byte)in_RSI[local_24 + 3] < 0x71) {
                  local_38[5] = 0x2d;
                  local_38[6] = in_RSI[local_24 + 3] + -0x50;
                }
                else if ((byte)in_RSI[local_24 + 3] < 0x81) {
                  local_38[5] = 0x2e;
                  local_38[6] = in_RSI[local_24 + 3] + -0x60;
                }
              }
              if (local_38[5] != '\0') {
                local_38[1] = local_38[1] | 8;
              }
              local_38 = local_38 + 7;
            }
            local_24 = local_24 + 4;
          }
          *local_38 = 0xff;
          local_38 = local_38 + 7;
        }
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

static int it_okt_read_pattern(IT_PATTERN *pattern, const unsigned char *data, int length, int n_channels)
{
	int pos;
	int channel;
	int row;
	int n_rows;
	IT_ENTRY *entry;

	if (length < 2) return -1;

	n_rows = (data[0] << 8) | data[1];
	if (!n_rows) n_rows = 64;

	if (length < 2 + (n_rows * n_channels * 4)) return -1;

	pattern->n_rows = n_rows;

	/* compute number of entries */
	pattern->n_entries = n_rows; /* Account for the row end markers */
	pos = 2;
	for (row = 0; row < pattern->n_rows; row++) {
		for (channel = 0; channel < n_channels; channel++) {
			if (data[pos+0] | data[pos+2])
				pattern->n_entries++;
			pos += 4;
		}
	}

	pattern->entry = (IT_ENTRY *) malloc(pattern->n_entries * sizeof(*pattern->entry));
	if (!pattern->entry)
		return -1;

	entry = pattern->entry;
	pos = 2;
	for (row = 0; row < n_rows; row++) {
		for (channel = 0; channel < n_channels; channel++) {
			if (data[pos+0] | data[pos+2]) {
				entry->channel = channel;
				entry->mask = 0;

				if (data[pos+0] > 0 && data[pos+0] <= 36) {
					entry->mask |= IT_ENTRY_NOTE | IT_ENTRY_INSTRUMENT;

					entry->note = data[pos+0] + 35;
					entry->instrument = data[pos+1] + 1;
				}

				entry->effect = 0;
				entry->effectvalue = data[pos+3];

				switch (data[pos+2]) {
				case  2: if (data[pos+3]) entry->effect = IT_PORTAMENTO_DOWN; break; // XXX code calls this rs_portu, but it's adding to the period, which decreases the pitch
				case 13: if (data[pos+3]) entry->effect = IT_OKT_NOTE_SLIDE_DOWN; break;
				case 21: if (data[pos+3]) entry->effect = IT_OKT_NOTE_SLIDE_DOWN_ROW; break;

				case  1: if (data[pos+3]) entry->effect = IT_PORTAMENTO_UP; break;   // XXX same deal here, increasing the pitch
				case 17: if (data[pos+3]) entry->effect = IT_OKT_NOTE_SLIDE_UP; break;
				case 30: if (data[pos+3]) entry->effect = IT_OKT_NOTE_SLIDE_UP_ROW; break;

				case 10: if (data[pos+3]) entry->effect = IT_OKT_ARPEGGIO_3; break;
				case 11: if (data[pos+3]) entry->effect = IT_OKT_ARPEGGIO_4; break;
				case 12: if (data[pos+3]) entry->effect = IT_OKT_ARPEGGIO_5; break;

				case 15: entry->effect = IT_S; entry->effectvalue = EFFECT_VALUE(IT_S_SET_FILTER, data[pos+3] & 0x0F); break;

				case 25: entry->effect = IT_JUMP_TO_ORDER; break;

				case 27: entry->note = IT_NOTE_OFF; entry->mask |= IT_ENTRY_NOTE; break;

				case 28: entry->effect = IT_SET_SPEED; break;

				case 31:
					if ( data[pos+3] <= 0x40 ) entry->effect = IT_SET_CHANNEL_VOLUME;
					else if ( data[pos+3] <= 0x50 ) { entry->effect = IT_OKT_VOLUME_SLIDE_DOWN; entry->effectvalue = data[pos+3] - 0x40; }
					else if ( data[pos+3] <= 0x60 ) { entry->effect = IT_OKT_VOLUME_SLIDE_UP;   entry->effectvalue = data[pos+3] - 0x50; }
					else if ( data[pos+3] <= 0x70 ) { entry->effect = IT_OKT_VOLUME_SLIDE_DOWN; entry->effectvalue = data[pos+3] - 0x50; }
					else if ( data[pos+3] <= 0x80 ) { entry->effect = IT_OKT_VOLUME_SLIDE_UP;   entry->effectvalue = data[pos+3] - 0x60; }
					break;
				}

				if ( entry->effect ) entry->mask |= IT_ENTRY_EFFECT;

				entry++;
			}
			pos += 4;
		}
		IT_SET_END_ROW(entry);
		entry++;
	}

	return 0;
}